

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O2

void __thiscall InlineeFrameRecord::Dump(InlineeFrameRecord *this)

{
  BOOLEAN BVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  char16 *pcVar4;
  uint i;
  ulong uVar5;
  
  do {
    pcVar4 = Js::ParseableFunctionInfo::GetExternalDisplayName
                       (&this->functionBody->super_ParseableFunctionInfo);
    uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->functionBody);
    LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->functionBody);
    Output::Print(L"%s [#%u.%u] args:",pcVar4,(ulong)uVar2,(ulong)LVar3);
    for (uVar5 = 0; uVar5 < this->argCount; uVar5 = uVar5 + 1) {
      DumpOffset(this,this->argOffsets[uVar5]);
      BVar1 = BVUnitT<unsigned_long>::Test(&this->floatArgs,(BVIndex)uVar5);
      pcVar4 = L"f ";
      if (BVar1 == '\0') {
        BVar1 = BVUnitT<unsigned_long>::Test(&this->losslessInt32Args,(BVIndex)uVar5);
        pcVar4 = L"i ";
        if (BVar1 != '\0') goto LAB_005100b4;
      }
      else {
LAB_005100b4:
        Output::Print(pcVar4);
      }
      Output::Print(L", ");
    }
    InlineeFrameInfo::Dump(this->frameInfo);
    Output::Print(L"func: ");
    DumpOffset(this,this->functionOffset);
    this = this->parent;
    if (this == (InlineeFrameRecord *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void InlineeFrameRecord::Dump() const
{
    Output::Print(_u("%s [#%u.%u] args:"), this->functionBody->GetExternalDisplayName(), this->functionBody->GetSourceContextId(), this->functionBody->GetLocalFunctionId());
    for (uint i = 0; i < argCount; i++)
    {
        DumpOffset(argOffsets[i]);
        if (floatArgs.Test(i))
        {
            Output::Print(_u("f "));
        }
        else if (losslessInt32Args.Test(i))
        {
            Output::Print(_u("i "));
        }
        Output::Print(_u(", "));
    }
    this->frameInfo->Dump();

    Output::Print(_u("func: "));
    DumpOffset(functionOffset);

    if (this->parent)
    {
        parent->Dump();
    }
}